

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3>::
TriangleStipGen(CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *this,
               CColorArray *coords,float widthStart,float widthEnd,float heightStart,float heightEnd
               ,uint primNum)

{
  int iVar1;
  int iVar2;
  uint j;
  int iVar3;
  float fVar4;
  Vector<float,_4> local_54;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  iVar2 = (int)coords;
  if (iVar2 != 0) {
    local_40 = 2.0 / (float)iVar2;
    local_34 = (widthEnd - widthStart) / (float)iVar2;
    iVar1 = 0;
    local_44 = widthStart;
    do {
      local_38 = (float)iVar1 * local_34 + local_44;
      local_3c = local_34 + local_38;
      iVar3 = 0;
      do {
        fVar4 = (float)iVar3 * local_40 + -1.0;
        local_54.m_data[1] = local_38;
        local_54.m_data[2] = 0.0;
        local_54.m_data[3] = 1.0;
        local_54.m_data[0] = fVar4;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,
                   &local_54);
        local_54.m_data[1] = local_3c;
        local_54.m_data[2] = 0.0;
        local_54.m_data[3] = 1.0;
        local_54.m_data[0] = fVar4;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,
                   &local_54);
        fVar4 = fVar4 + local_40;
        local_54.m_data[1] = local_38;
        local_54.m_data[2] = 0.0;
        local_54.m_data[3] = 1.0;
        local_54.m_data[0] = fVar4;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,
                   &local_54);
        local_54.m_data[1] = local_3c;
        local_54.m_data[2] = 0.0;
        local_54.m_data[3] = 1.0;
        local_54.m_data[0] = fVar4;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,
                   &local_54);
        iVar3 = iVar3 + 1;
      } while (iVar2 != iVar3);
      iVar1 = iVar1 + 1;
    } while (iVar1 != iVar2);
  }
  return;
}

Assistant:

void TriangleStipGen(CColorArray& coords, float widthStart, float widthEnd, float heightStart, float heightEnd,
						 unsigned int primNum)
	{
		float widthStep  = (widthEnd - widthStart) / static_cast<float>(primNum);
		float heightStep = (heightEnd - heightStart) / static_cast<float>(primNum);
		for (unsigned int i = 0; i < primNum; ++i)
		{
			float heightOffset = heightStart + heightStep * static_cast<float>(i);
			for (unsigned int j = 0; j < primNum; ++j)
			{
				float widthOffset = widthStart + widthStep * static_cast<float>(j);

				coords.push_back(tcu::Vec4(widthOffset, heightOffset, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset, heightOffset + heightStep, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset + widthStep, heightOffset, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset + widthStep, heightOffset + heightStep, 0.0f, 1.0f));
			}
		}
	}